

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void getNameAndString(int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *__s;
  string *psVar3;
  invalid_argument *this;
  allocator<char> local_a2;
  allocator<char> local_a1;
  long *local_a0;
  long local_98;
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  SetAttr local_60;
  
  iVar2 = *i;
  if (iVar2 <= argc + -3) {
    __s = argv[(long)iVar2 + 2];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,argv[(long)iVar2 + 1],&local_a1);
    psVar3 = (string *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,__s,&local_a2);
    Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute(psVar3);
    paVar1 = &local_60.name.field_2;
    local_60.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_a0,local_98 + (long)local_a0);
    local_60.part = part;
    local_60.attr = (Attribute *)psVar3;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.name._M_dataplus._M_p,local_60.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    *i = *i + 3;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a name and string");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getNameAndString (int argc, char** argv, int& i, int part, SetAttrVector& attrs)
{
    if (i > argc - 3) throw invalid_argument ("Expected a name and string");

    const char* attrName = argv[i + 1];
    const char* str      = argv[i + 2];
    attrs.push_back (SetAttr (attrName, part, new StringAttribute (str)));
    i += 3;
}